

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

void SystemZ_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *in_RDI;
  
  MCRegisterInfo_InitMCRegisterInfo
            (in_RDI,SystemZRegDesc,0xc2,0,0,SystemZMCRegisterClasses,0x15,(uint16_t (*) [2])0x0,0,
             SystemZRegDiffLists,(char *)0x0,SystemZSubRegIdxLists,7,(uint16_t *)0x0);
  return;
}

Assistant:

void SystemZ_init(MCRegisterInfo *MRI)
{
	/*
	InitMCRegisterInfo(SystemZRegDesc, 98, RA, PC,
			SystemZMCRegisterClasses, 12,
			SystemZRegUnitRoots,
			49,
			SystemZRegDiffLists,
			SystemZRegStrings,
			SystemZSubRegIdxLists,
			7,
			SystemZSubRegIdxRanges,
			SystemZRegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, SystemZRegDesc, 194,
			0, 0,
			SystemZMCRegisterClasses, 21,
			0, 0,
			SystemZRegDiffLists,
			0,
			SystemZSubRegIdxLists, 7,
			0);
}